

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_partial_union.cpp
# Opt level: O0

void __thiscall
PartialUnion_create_adjacency_lists_Test::TestBody(PartialUnion_create_adjacency_lists_Test *this)

{
  size_t *this_00;
  pointer *this_01;
  allocator<int> *paVar1;
  allocator<std::vector<int,_std::allocator<int>_>_> *paVar2;
  allocator<std::array<int,_8UL>_> *paVar3;
  allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *paVar4;
  initializer_list<std::array<int,_8UL>_> __l;
  initializer_list<std::array<int,_8UL>_> __l_00;
  initializer_list<std::array<int,_8UL>_> __l_01;
  initializer_list<std::array<int,_8UL>_> __l_02;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_03;
  initializer_list<int> __l_04;
  initializer_list<int> __l_05;
  initializer_list<int> __l_06;
  initializer_list<int> __l_07;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_08;
  initializer_list<std::array<int,_8UL>_> __l_09;
  initializer_list<std::array<int,_8UL>_> __l_10;
  initializer_list<std::array<int,_8UL>_> __l_11;
  initializer_list<std::array<int,_8UL>_> __l_12;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_13;
  initializer_list<int> __l_14;
  initializer_list<int> __l_15;
  initializer_list<int> __l_16;
  initializer_list<int> __l_17;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_18;
  initializer_list<std::array<int,_8UL>_> __l_19;
  initializer_list<std::array<int,_8UL>_> __l_20;
  initializer_list<std::array<int,_8UL>_> __l_21;
  initializer_list<std::array<int,_8UL>_> __l_22;
  initializer_list<std::array<int,_8UL>_> __l_23;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_24;
  initializer_list<int> __l_25;
  initializer_list<int> __l_26;
  initializer_list<int> __l_27;
  initializer_list<int> __l_28;
  initializer_list<int> __l_29;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_30;
  initializer_list<std::array<int,_8UL>_> __l_31;
  initializer_list<std::array<int,_8UL>_> __l_32;
  initializer_list<std::array<int,_8UL>_> __l_33;
  initializer_list<std::array<int,_8UL>_> __l_34;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_35;
  initializer_list<int> __l_36;
  initializer_list<int> __l_37;
  initializer_list<int> __l_38;
  initializer_list<int> __l_39;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_40;
  initializer_list<std::array<int,_8UL>_> __l_41;
  initializer_list<std::array<int,_8UL>_> __l_42;
  initializer_list<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
  __l_43;
  initializer_list<int> __l_44;
  initializer_list<int> __l_45;
  initializer_list<std::vector<int,_std::allocator<int>_>_> __l_46;
  bool bVar5;
  int snapshots_00;
  reference pvVar6;
  char *pcVar7;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_1830;
  vector<int,_std::allocator<int>_> *local_17d0;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_1770;
  vector<int,_std::allocator<int>_> *local_1710;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_16b0;
  vector<int,_std::allocator<int>_> *local_1640;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_15d0;
  vector<int,_std::allocator<int>_> *local_1570;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_1510;
  vector<int,_std::allocator<int>_> *local_14c0;
  AssertHelper local_1458;
  Message local_1450;
  undefined1 local_1448 [8];
  AssertionResult gtest_ar_9;
  Message local_1430;
  undefined1 local_1428 [8];
  AssertionResult gtest_ar_8;
  Message local_1410;
  undefined1 local_1408 [8];
  AssertionResult gtest_ar_7;
  Message local_13f0;
  undefined1 local_13e8 [8];
  AssertionResult gtest_ar_6;
  Message local_13d0;
  undefined1 local_13c8 [8];
  AssertionResult gtest_ar_5;
  Message local_13b0;
  undefined1 local_13a8 [8];
  AssertionResult gtest_ar_4;
  Message local_1390;
  undefined1 local_1388 [8];
  AssertionResult gtest_ar_3;
  Message local_1370;
  undefined1 local_1368 [8];
  AssertionResult gtest_ar_2;
  Message local_1350;
  undefined1 local_1348 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_1330;
  Message local_1328;
  undefined1 local_1320 [8];
  AssertionResult gtest_ar;
  array<int,_8UL> local_1308;
  undefined8 local_12e8;
  undefined8 uStack_12e0;
  undefined8 local_12d8;
  undefined8 uStack_12d0;
  iterator local_12c0;
  size_type local_12b8;
  allocator<std::array<int,_8UL>_> local_12a9;
  array<int,_8UL> local_12a8;
  undefined8 local_1288;
  undefined8 uStack_1280;
  undefined8 local_1278;
  undefined8 uStack_1270;
  iterator local_1260;
  size_type local_1258;
  allocator<std::array<int,_8UL>_> local_1249;
  array<int,_8UL> local_1248;
  undefined8 local_1228;
  undefined8 uStack_1220;
  undefined8 local_1218;
  undefined8 uStack_1210;
  iterator local_1200;
  size_type local_11f8;
  allocator<std::array<int,_8UL>_> local_11e9;
  array<int,_8UL> local_11e8;
  undefined8 local_11c8;
  undefined8 uStack_11c0;
  undefined8 local_11b8;
  undefined8 uStack_11b0;
  iterator local_11a0;
  size_type local_1198;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_1190;
  undefined1 local_1188 [24];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_1170;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_1158;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_1140;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_1128;
  undefined1 local_1110 [24];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_05_ground_truth;
  int local_10e0 [2];
  iterator local_10d8;
  size_type local_10d0;
  allocator<int> local_10c1;
  int local_10c0 [2];
  iterator local_10b8;
  size_type local_10b0;
  allocator<int> local_10a1;
  int local_10a0 [2];
  iterator local_1098;
  size_type local_1090;
  allocator<int> local_1081;
  int local_1080 [2];
  iterator local_1078;
  size_type local_1070;
  vector<int,_std::allocator<int>_> *local_1068;
  vector<int,_std::allocator<int>_> local_1060;
  vector<int,_std::allocator<int>_> local_1048;
  vector<int,_std::allocator<int>_> local_1030;
  vector<int,_std::allocator<int>_> local_1018;
  vector<int,_std::allocator<int>_> local_1000;
  undefined1 local_fe8 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_05_ground_truth;
  array<int,_8UL> local_fb8;
  undefined8 local_f98;
  undefined8 uStack_f90;
  undefined8 local_f88;
  undefined8 uStack_f80;
  undefined8 local_f78;
  undefined8 uStack_f70;
  undefined8 local_f68;
  undefined8 uStack_f60;
  iterator local_f50;
  size_type local_f48;
  allocator<std::array<int,_8UL>_> local_f39;
  array<int,_8UL> local_f38;
  undefined8 local_f18;
  undefined8 uStack_f10;
  undefined8 local_f08;
  undefined8 uStack_f00;
  iterator local_ef0;
  size_type local_ee8;
  allocator<std::array<int,_8UL>_> local_ed9;
  array<int,_8UL> local_ed8;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  iterator local_e90;
  size_type local_e88;
  allocator<std::array<int,_8UL>_> local_e79;
  array<int,_8UL> local_e78;
  undefined8 local_e58;
  undefined8 uStack_e50;
  undefined8 local_e48;
  undefined8 uStack_e40;
  undefined8 local_e38;
  undefined8 uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  iterator local_e10;
  size_type local_e08;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_e00;
  undefined1 local_df8 [24];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_de0;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_dc8;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_db0;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_d98;
  undefined1 local_d80 [24];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_04_ground_truth;
  allocator<int> local_d31;
  int local_d30 [2];
  iterator local_d28;
  size_type local_d20;
  allocator<int> local_d11;
  int local_d10 [2];
  iterator local_d08;
  size_type local_d00;
  allocator<int> local_cf5;
  int local_cf4 [3];
  iterator local_ce8;
  size_type local_ce0;
  vector<int,_std::allocator<int>_> *local_cd8;
  vector<int,_std::allocator<int>_> local_cd0;
  vector<int,_std::allocator<int>_> local_cb8;
  vector<int,_std::allocator<int>_> local_ca0;
  vector<int,_std::allocator<int>_> local_c88;
  vector<int,_std::allocator<int>_> local_c70;
  undefined1 local_c58 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_04_ground_truth;
  array<int,_8UL> local_c28;
  iterator local_c00;
  size_type local_bf8;
  allocator<std::array<int,_8UL>_> local_be9;
  array<int,_8UL> local_be8;
  undefined8 local_bc8;
  undefined8 uStack_bc0;
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  iterator local_ba0;
  size_type local_b98;
  allocator<std::array<int,_8UL>_> local_b89;
  array<int,_8UL> local_b88;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  iterator local_b40;
  size_type local_b38;
  allocator<std::array<int,_8UL>_> local_b29;
  array<int,_8UL> local_b28;
  undefined8 local_b08;
  undefined8 uStack_b00;
  undefined8 local_af8;
  undefined8 uStack_af0;
  iterator local_ae0;
  size_type local_ad8;
  allocator<std::array<int,_8UL>_> local_ac9;
  array<int,_8UL> local_ac8;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  iterator local_a68;
  size_type local_a60;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_a58;
  undefined1 local_a50 [48];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_a20;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_a08;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_9f0;
  undefined1 local_9d8 [24];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_03_ground_truth;
  allocator<int> local_991;
  int local_990 [2];
  iterator local_988;
  size_type local_980;
  allocator<int> local_971;
  int local_970 [2];
  iterator local_968;
  size_type local_960;
  allocator<int> local_951;
  int local_950 [2];
  iterator local_948;
  size_type local_940;
  allocator<int> local_935;
  int local_934 [3];
  iterator local_928;
  size_type local_920;
  vector<int,_std::allocator<int>_> *local_918;
  vector<int,_std::allocator<int>_> local_910;
  vector<int,_std::allocator<int>_> local_8f8;
  vector<int,_std::allocator<int>_> local_8e0;
  vector<int,_std::allocator<int>_> local_8c8;
  vector<int,_std::allocator<int>_> local_8b0;
  undefined1 local_898 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_03_ground_truth;
  array<int,_8UL> local_868;
  iterator local_840;
  size_type local_838;
  allocator<std::array<int,_8UL>_> local_829;
  array<int,_8UL> local_828;
  iterator local_800;
  size_type local_7f8;
  allocator<std::array<int,_8UL>_> local_7e9;
  array<int,_8UL> local_7e8;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  undefined8 local_7b8;
  undefined8 uStack_7b0;
  undefined8 local_7a8;
  undefined8 uStack_7a0;
  undefined8 local_798;
  undefined8 uStack_790;
  iterator local_780;
  size_type local_778;
  allocator<std::array<int,_8UL>_> local_769;
  array<int,_8UL> local_768;
  iterator local_748;
  size_type local_740;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_738;
  undefined1 local_730 [48];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_700;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_6e8;
  undefined1 local_6d0 [24];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_02_ground_truth;
  allocator<int> local_68d;
  int local_68c;
  iterator local_688;
  size_type local_680;
  allocator<int> local_675;
  int local_674 [3];
  iterator local_668;
  size_type local_660;
  allocator<int> local_655;
  int local_654;
  iterator local_650;
  size_type local_648;
  vector<int,_std::allocator<int>_> *local_640;
  vector<int,_std::allocator<int>_> local_638;
  vector<int,_std::allocator<int>_> local_620;
  vector<int,_std::allocator<int>_> local_608;
  vector<int,_std::allocator<int>_> local_5f0;
  undefined1 local_5d8 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_02_ground_truth;
  array<int,_8UL> local_5a8;
  iterator local_580;
  size_type local_578;
  allocator<std::array<int,_8UL>_> local_569;
  array<int,_8UL> local_568;
  iterator local_540;
  size_type local_538;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *local_530;
  undefined1 local_528 [48];
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_4f8;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_4e0;
  undefined1 local_4c8 [24];
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  adjacency_info_01_ground_truth;
  allocator<int> local_485;
  int local_484;
  iterator local_480;
  size_type local_478;
  vector<int,_std::allocator<int>_> *local_470;
  vector<int,_std::allocator<int>_> local_468;
  vector<int,_std::allocator<int>_> local_450;
  vector<int,_std::allocator<int>_> local_438;
  vector<int,_std::allocator<int>_> local_420;
  undefined1 local_408 [24];
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  adjacency_list_01_ground_truth;
  vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
  adjacency_lists;
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  edges_set;
  vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> newedges;
  undefined1 local_378 [4];
  int snapshots;
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  labeled_nodes;
  PartialUnion local_328;
  allocator local_1a9;
  string local_1a8 [8];
  string input_file;
  int window_size;
  bool search_for_anomalies;
  PartialUnion pu;
  FileReader fr;
  PartialUnion_create_adjacency_lists_Test *this_local;
  
  dgrminer::PartialUnion::PartialUnion((PartialUnion *)&window_size);
  input_file.field_2._M_local_buf[0xf] = '\0';
  input_file.field_2._8_4_ = 10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"data/intro_example",&local_1a9);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  std::__cxx11::string::string
            ((string *)&labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,local_1a8);
  dgrminer::FileReader::read_dynamic_graph_from_file
            (&local_328,
             (FileReader *)
             ((long)&pu.rawAdjacencyLists.
                     super__Vector_base<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>,_std::allocator<std::unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             (string *)&labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count,
             input_file.field_2._8_4_,(bool)(input_file.field_2._M_local_buf[0xf] & 1));
  dgrminer::PartialUnion::operator=((PartialUnion *)&window_size,&local_328);
  dgrminer::PartialUnion::~PartialUnion(&local_328);
  std::__cxx11::string::~string
            ((string *)&labeled_nodes._M_t._M_impl.super__Rb_tree_header._M_node_count);
  dgrminer::PartialUnion::compute_labeled_nodes
            ((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
              *)local_378,(PartialUnion *)&window_size);
  snapshots_00 = dgrminer::PartialUnion::getNumberOfSnapshots((PartialUnion *)&window_size);
  this_00 = &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this_00);
  this_01 = &adjacency_lists.
             super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
  std::
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::set((set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
         *)this_01);
  dgrminer::PartialUnion::compute_labeled_edges
            ((PartialUnion *)&window_size,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)this_00,
             (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
              *)this_01,
             (set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
              *)local_378,false);
  dgrminer::PartialUnion::createAdjacencyLists
            ((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *)
             &adjacency_list_01_ground_truth.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(PartialUnion *)&window_size,
             (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count,snapshots_00);
  adjacency_info_01_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_484 = 1;
  local_480 = &local_484;
  local_478 = 1;
  local_470 = &local_468;
  std::allocator<int>::allocator(&local_485);
  __l_45._M_len = local_478;
  __l_45._M_array = local_480;
  std::vector<int,_std::allocator<int>_>::vector(&local_468,__l_45,&local_485);
  adjacency_info_01_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&adjacency_info_01_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  local_470 = &local_450;
  std::allocator<int>::allocator(paVar1);
  __l_44._M_len = 1;
  __l_44._M_array =
       (iterator)
       ((long)&adjacency_info_01_ground_truth.
               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector(&local_450,__l_44,paVar1);
  local_470 = &local_438;
  local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_438.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_470);
  local_470 = &local_420;
  local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_420.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_470);
  adjacency_info_01_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_408._0_8_ = &local_468;
  local_408._8_8_ = (pointer)0x4;
  paVar2 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&adjacency_info_01_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar2);
  __l_46._M_len = local_408._8_8_;
  __l_46._M_array = (iterator)local_408._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_408 + 0x10),__l_46,paVar2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&adjacency_info_01_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_14c0 = (vector<int,_std::allocator<int>_> *)local_408;
  do {
    local_14c0 = local_14c0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_14c0);
  } while (local_14c0 != &local_468);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&adjacency_info_01_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<int>::~allocator(&local_485);
  adjacency_list_02_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_568._M_elems[4] = 0;
  local_568._M_elems[5] = 4;
  local_568._M_elems[6] = 0;
  local_568._M_elems[7] = 1;
  local_568._M_elems[0] = 2;
  local_568._M_elems[1] = 0;
  local_568._M_elems[2] = 1;
  local_568._M_elems[3] = 6;
  local_540 = &local_568;
  local_538 = 1;
  local_530 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_528;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_569);
  __l_42._M_len = local_538;
  __l_42._M_array = local_540;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_528,
             __l_42,&local_569);
  local_5a8._M_elems[4] = 0;
  local_5a8._M_elems[5] = 2;
  local_5a8._M_elems[6] = 0;
  local_5a8._M_elems[7] = 1;
  local_5a8._M_elems[0] = 4;
  local_5a8._M_elems[1] = 0;
  local_5a8._M_elems[2] = 2;
  local_5a8._M_elems[3] = 6;
  local_580 = &local_5a8;
  local_578 = 1;
  paVar3 = (allocator<std::array<int,_8UL>_> *)
           ((long)&adjacency_list_02_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_530 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
              (local_528 + 0x18);
  std::allocator<std::array<int,_8UL>_>::allocator(paVar3);
  __l_41._M_len = local_578;
  __l_41._M_array = local_580;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_528 + 0x18),__l_41,paVar3);
  local_530 = &local_4f8;
  local_4f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4f8.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector(local_530);
  local_530 = &local_4e0;
  local_4e0.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_4e0.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4e0.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector(local_530);
  adjacency_list_02_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_4c8._0_8_ = local_528;
  local_4c8._8_8_ = (pointer)0x4;
  paVar4 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *)
           ((long)&adjacency_list_02_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  allocator(paVar4);
  __l_43._M_len = local_4c8._8_8_;
  __l_43._M_array = (iterator)local_4c8._0_8_;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)(local_4c8 + 0x10),__l_43,paVar4);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
              *)((long)&adjacency_list_02_ground_truth.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_1510 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_4c8;
  do {
    local_1510 = local_1510 + -1;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(local_1510);
  } while (local_1510 !=
           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_528);
  std::allocator<std::array<int,_8UL>_>::~allocator
            ((allocator<std::array<int,_8UL>_> *)
             ((long)&adjacency_list_02_ground_truth.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_569);
  adjacency_info_02_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_654 = 1;
  local_650 = &local_654;
  local_648 = 1;
  local_640 = &local_638;
  std::allocator<int>::allocator(&local_655);
  __l_39._M_len = local_648;
  __l_39._M_array = local_650;
  std::vector<int,_std::allocator<int>_>::vector(&local_638,__l_39,&local_655);
  local_674[0] = 0;
  local_674[1] = 2;
  local_674[2] = 3;
  local_668 = local_674;
  local_660 = 3;
  local_640 = &local_620;
  std::allocator<int>::allocator(&local_675);
  __l_38._M_len = local_660;
  __l_38._M_array = local_668;
  std::vector<int,_std::allocator<int>_>::vector(&local_620,__l_38,&local_675);
  local_68c = 1;
  local_688 = &local_68c;
  local_680 = 1;
  local_640 = &local_608;
  std::allocator<int>::allocator(&local_68d);
  __l_37._M_len = local_680;
  __l_37._M_array = local_688;
  std::vector<int,_std::allocator<int>_>::vector(&local_608,__l_37,&local_68d);
  adjacency_info_02_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  paVar1 = (allocator<int> *)
           ((long)&adjacency_info_02_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  local_640 = &local_5f0;
  std::allocator<int>::allocator(paVar1);
  __l_36._M_len = 1;
  __l_36._M_array =
       (iterator)
       ((long)&adjacency_info_02_ground_truth.
               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector(&local_5f0,__l_36,paVar1);
  adjacency_info_02_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_5d8._0_8_ = &local_638;
  local_5d8._8_8_ = (pointer)0x4;
  paVar2 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&adjacency_info_02_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar2);
  __l_40._M_len = local_5d8._8_8_;
  __l_40._M_array = (iterator)local_5d8._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_5d8 + 0x10),__l_40,paVar2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&adjacency_info_02_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_1570 = (vector<int,_std::allocator<int>_> *)local_5d8;
  do {
    local_1570 = local_1570 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1570);
  } while (local_1570 != &local_638);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&adjacency_info_02_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<int>::~allocator(&local_68d);
  std::allocator<int>::~allocator(&local_675);
  std::allocator<int>::~allocator(&local_655);
  adjacency_list_03_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_768._M_elems[4] = 1;
  local_768._M_elems[5] = 3;
  local_768._M_elems[6] = -1;
  local_768._M_elems[7] = 1;
  local_768._M_elems[0] = 8;
  local_768._M_elems[1] = 1;
  local_768._M_elems[2] = 1;
  local_768._M_elems[3] = 0xb;
  local_748 = &local_768;
  local_740 = 1;
  local_738 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_730;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_769);
  __l_34._M_len = local_740;
  __l_34._M_array = local_748;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_730,
             __l_34,&local_769);
  local_798 = 0xa00000000;
  uStack_790 = 0x300000001;
  local_7a8 = 0xffffffff00000003;
  uStack_7a0 = 0x600000001;
  local_7b8 = 0xa00000000;
  uStack_7b0 = 0x200000001;
  local_7c8 = 0xffffffff00000003;
  uStack_7c0 = 0x600000001;
  local_7e8._M_elems[4] = 1;
  local_7e8._M_elems[5] = 8;
  local_7e8._M_elems[6] = 1;
  local_7e8._M_elems[7] = 1;
  local_7e8._M_elems[0] = 3;
  local_7e8._M_elems[1] = -1;
  local_7e8._M_elems[2] = 2;
  local_7e8._M_elems[3] = 0xb;
  local_780 = &local_7e8;
  local_778 = 3;
  local_738 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
              (local_730 + 0x18);
  std::allocator<std::array<int,_8UL>_>::allocator(&local_7e9);
  __l_33._M_len = local_778;
  __l_33._M_array = local_780;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_730 + 0x18),__l_33,&local_7e9);
  local_828._M_elems[4] = 0;
  local_828._M_elems[5] = 3;
  local_828._M_elems[6] = -1;
  local_828._M_elems[7] = 2;
  local_828._M_elems[0] = 10;
  local_828._M_elems[1] = 1;
  local_828._M_elems[2] = 2;
  local_828._M_elems[3] = 6;
  local_800 = &local_828;
  local_7f8 = 1;
  local_738 = &local_700;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_829);
  __l_32._M_len = local_7f8;
  __l_32._M_array = local_800;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_700,__l_32,&local_829);
  local_868._M_elems[4] = 0;
  local_868._M_elems[5] = 3;
  local_868._M_elems[6] = -1;
  local_868._M_elems[7] = 3;
  local_868._M_elems[0] = 10;
  local_868._M_elems[1] = 1;
  local_868._M_elems[2] = 2;
  local_868._M_elems[3] = 6;
  local_840 = &local_868;
  local_838 = 1;
  paVar3 = (allocator<std::array<int,_8UL>_> *)
           ((long)&adjacency_list_03_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_738 = &local_6e8;
  std::allocator<std::array<int,_8UL>_>::allocator(paVar3);
  __l_31._M_len = local_838;
  __l_31._M_array = local_840;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_6e8,__l_31,paVar3);
  adjacency_list_03_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_6d0._0_8_ = local_730;
  local_6d0._8_8_ = (pointer)0x4;
  paVar4 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *)
           ((long)&adjacency_list_03_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  allocator(paVar4);
  __l_35._M_len = local_6d0._8_8_;
  __l_35._M_array = (iterator)local_6d0._0_8_;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)(local_6d0 + 0x10),__l_35,paVar4);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
              *)((long)&adjacency_list_03_ground_truth.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_15d0 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_6d0;
  do {
    local_15d0 = local_15d0 + -1;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(local_15d0);
  } while (local_15d0 !=
           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_730);
  std::allocator<std::array<int,_8UL>_>::~allocator
            ((allocator<std::array<int,_8UL>_> *)
             ((long)&adjacency_list_03_ground_truth.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_829);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_7e9);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_769);
  adjacency_info_03_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_934[0] = 2;
  local_934[1] = 3;
  local_934[2] = 4;
  local_928 = local_934;
  local_920 = 3;
  local_918 = &local_910;
  std::allocator<int>::allocator(&local_935);
  __l_29._M_len = local_920;
  __l_29._M_array = local_928;
  std::vector<int,_std::allocator<int>_>::vector(&local_910,__l_29,&local_935);
  local_950[0] = 2;
  local_950[1] = 3;
  local_948 = local_950;
  local_940 = 2;
  local_918 = &local_8f8;
  std::allocator<int>::allocator(&local_951);
  __l_28._M_len = local_940;
  __l_28._M_array = local_948;
  std::vector<int,_std::allocator<int>_>::vector(&local_8f8,__l_28,&local_951);
  local_970[0] = 1;
  local_970[1] = 0;
  local_968 = local_970;
  local_960 = 2;
  local_918 = &local_8e0;
  std::allocator<int>::allocator(&local_971);
  __l_27._M_len = local_960;
  __l_27._M_array = local_968;
  std::vector<int,_std::allocator<int>_>::vector(&local_8e0,__l_27,&local_971);
  local_990[0] = 1;
  local_990[1] = 0;
  local_988 = local_990;
  local_980 = 2;
  local_918 = &local_8c8;
  std::allocator<int>::allocator(&local_991);
  __l_26._M_len = local_980;
  __l_26._M_array = local_988;
  std::vector<int,_std::allocator<int>_>::vector(&local_8c8,__l_26,&local_991);
  adjacency_info_03_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&adjacency_info_03_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  local_918 = &local_8b0;
  std::allocator<int>::allocator(paVar1);
  __l_25._M_len = 1;
  __l_25._M_array =
       (iterator)
       ((long)&adjacency_info_03_ground_truth.
               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector(&local_8b0,__l_25,paVar1);
  adjacency_info_03_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_898._0_8_ = &local_910;
  local_898._8_8_ = (pointer)0x5;
  paVar2 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&adjacency_info_03_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar2);
  __l_30._M_len = local_898._8_8_;
  __l_30._M_array = (iterator)local_898._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_898 + 0x10),__l_30,paVar2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&adjacency_info_03_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_1640 = (vector<int,_std::allocator<int>_> *)local_898;
  do {
    local_1640 = local_1640 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1640);
  } while (local_1640 != &local_910);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&adjacency_info_03_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<int>::~allocator(&local_991);
  std::allocator<int>::~allocator(&local_971);
  std::allocator<int>::~allocator(&local_951);
  std::allocator<int>::~allocator(&local_935);
  adjacency_list_04_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_a78 = 0x400000000;
  uStack_a70 = 0x600000000;
  local_a88 = 0x10000000c;
  uStack_a80 = 0x600000001;
  local_a98 = 0xd00000000;
  uStack_a90 = 0x500000001;
  local_aa8 = 0x10000000c;
  uStack_aa0 = 0x600000002;
  local_ac8._M_elems[4] = 0;
  local_ac8._M_elems[5] = 0xd;
  local_ac8._M_elems[6] = 1;
  local_ac8._M_elems[7] = 4;
  local_ac8._M_elems[0] = 0xc;
  local_ac8._M_elems[1] = 1;
  local_ac8._M_elems[2] = 2;
  local_ac8._M_elems[3] = 6;
  local_a68 = &local_ac8;
  local_a60 = 3;
  local_a58 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_a50;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_ac9);
  __l_23._M_len = local_a60;
  __l_23._M_array = local_a68;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_a50,
             __l_23,&local_ac9);
  local_af8 = 0xd00000001;
  uStack_af0 = 0x300000001;
  local_b08 = 0xfffffffe00000003;
  uStack_b00 = 0xb00000001;
  local_b28._M_elems[4] = 1;
  local_b28._M_elems[5] = 0xd;
  local_b28._M_elems[6] = 1;
  local_b28._M_elems[7] = 2;
  local_b28._M_elems[0] = 3;
  local_b28._M_elems[1] = -2;
  local_b28._M_elems[2] = 1;
  local_b28._M_elems[3] = 0xb;
  local_ae0 = &local_b28;
  local_ad8 = 2;
  local_a58 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
              (local_a50 + 0x18);
  std::allocator<std::array<int,_8UL>_>::allocator(&local_b29);
  __l_22._M_len = local_ad8;
  __l_22._M_array = local_ae0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             (local_a50 + 0x18),__l_22,&local_b29);
  local_b58 = 0xc00000000;
  uStack_b50 = 0x400000001;
  local_b68 = 0x10000000d;
  uStack_b60 = 0x600000001;
  local_b88._M_elems[4] = 1;
  local_b88._M_elems[5] = 3;
  local_b88._M_elems[6] = -2;
  local_b88._M_elems[7] = 2;
  local_b88._M_elems[0] = 0xd;
  local_b88._M_elems[1] = 1;
  local_b88._M_elems[2] = 2;
  local_b88._M_elems[3] = 0xb;
  local_b40 = &local_b88;
  local_b38 = 2;
  local_a58 = &local_a20;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_b89);
  __l_21._M_len = local_b38;
  __l_21._M_array = local_b40;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_a20,__l_21,&local_b89);
  local_bb8 = 0xc00000000;
  uStack_bb0 = 0x500000001;
  local_bc8 = 0x10000000d;
  uStack_bc0 = 0x600000001;
  local_be8._M_elems[4] = 1;
  local_be8._M_elems[5] = 3;
  local_be8._M_elems[6] = -2;
  local_be8._M_elems[7] = 3;
  local_be8._M_elems[0] = 0xd;
  local_be8._M_elems[1] = 1;
  local_be8._M_elems[2] = 2;
  local_be8._M_elems[3] = 0xb;
  local_ba0 = &local_be8;
  local_b98 = 2;
  local_a58 = &local_a08;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_be9);
  __l_20._M_len = local_b98;
  __l_20._M_array = local_ba0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_a08,__l_20,&local_be9);
  local_c28._M_elems[4] = 0;
  local_c28._M_elems[5] = 0xc;
  local_c28._M_elems[6] = 1;
  local_c28._M_elems[7] = 6;
  local_c28._M_elems[0] = 4;
  local_c28._M_elems[1] = 0;
  local_c28._M_elems[2] = 2;
  local_c28._M_elems[3] = 6;
  local_c00 = &local_c28;
  local_bf8 = 1;
  paVar3 = (allocator<std::array<int,_8UL>_> *)
           ((long)&adjacency_list_04_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_a58 = &local_9f0;
  std::allocator<std::array<int,_8UL>_>::allocator(paVar3);
  __l_19._M_len = local_bf8;
  __l_19._M_array = local_c00;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_9f0,__l_19,paVar3);
  adjacency_list_04_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_9d8._0_8_ = local_a50;
  local_9d8._8_8_ = (pointer)0x5;
  paVar4 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *)
           ((long)&adjacency_list_04_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  allocator(paVar4);
  __l_24._M_len = local_9d8._8_8_;
  __l_24._M_array = (iterator)local_9d8._0_8_;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)(local_9d8 + 0x10),__l_24,paVar4);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
              *)((long)&adjacency_list_04_ground_truth.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_16b0 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_9d8;
  do {
    local_16b0 = local_16b0 + -1;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(local_16b0);
  } while (local_16b0 !=
           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_a50);
  std::allocator<std::array<int,_8UL>_>::~allocator
            ((allocator<std::array<int,_8UL>_> *)
             ((long)&adjacency_list_04_ground_truth.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_be9);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_b89);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_b29);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_ac9);
  adjacency_info_04_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 1;
  local_cf4[0] = 2;
  local_cf4[1] = 3;
  local_cf4[2] = 4;
  local_ce8 = local_cf4;
  local_ce0 = 3;
  local_cd8 = &local_cd0;
  std::allocator<int>::allocator(&local_cf5);
  __l_17._M_len = local_ce0;
  __l_17._M_array = local_ce8;
  std::vector<int,_std::allocator<int>_>::vector(&local_cd0,__l_17,&local_cf5);
  local_cd8 = &local_cb8;
  local_cb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_cb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_cb8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_cd8);
  local_d10[0] = 0;
  local_d10[1] = 4;
  local_d08 = local_d10;
  local_d00 = 2;
  local_cd8 = &local_ca0;
  std::allocator<int>::allocator(&local_d11);
  __l_16._M_len = local_d00;
  __l_16._M_array = local_d08;
  std::vector<int,_std::allocator<int>_>::vector(&local_ca0,__l_16,&local_d11);
  local_d30[0] = 0;
  local_d30[1] = 4;
  local_d28 = local_d30;
  local_d20 = 2;
  local_cd8 = &local_c88;
  std::allocator<int>::allocator(&local_d31);
  __l_15._M_len = local_d20;
  __l_15._M_array = local_d28;
  std::vector<int,_std::allocator<int>_>::vector(&local_c88,__l_15,&local_d31);
  adjacency_info_04_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  paVar1 = (allocator<int> *)
           ((long)&adjacency_info_04_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 3);
  local_cd8 = &local_c70;
  std::allocator<int>::allocator(paVar1);
  __l_14._M_len = 3;
  __l_14._M_array =
       (iterator)
       ((long)&adjacency_info_04_ground_truth.
               super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage + 4);
  std::vector<int,_std::allocator<int>_>::vector(&local_c70,__l_14,paVar1);
  adjacency_info_04_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._2_1_ = 0;
  local_c58._0_8_ = &local_cd0;
  local_c58._8_8_ = (pointer)0x5;
  paVar2 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&adjacency_info_04_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar2);
  __l_18._M_len = local_c58._8_8_;
  __l_18._M_array = (iterator)local_c58._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_c58 + 0x10),__l_18,paVar2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&adjacency_info_04_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  local_1710 = (vector<int,_std::allocator<int>_> *)local_c58;
  do {
    local_1710 = local_1710 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_1710);
  } while (local_1710 != &local_cd0);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&adjacency_info_04_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 3));
  std::allocator<int>::~allocator(&local_d31);
  std::allocator<int>::~allocator(&local_d11);
  std::allocator<int>::~allocator(&local_cf5);
  adjacency_list_05_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_e28 = 0x300000001;
  uStack_e20 = 0x6ffffffff;
  local_e38 = 0x100000008;
  uStack_e30 = 0xb00000001;
  local_e48 = 0xa00000001;
  uStack_e40 = 0x500000001;
  local_e58 = 0x100000008;
  uStack_e50 = 0xb00000002;
  local_e78._M_elems[4] = 1;
  local_e78._M_elems[5] = 10;
  local_e78._M_elems[6] = 1;
  local_e78._M_elems[7] = 4;
  local_e78._M_elems[0] = 8;
  local_e78._M_elems[1] = 1;
  local_e78._M_elems[2] = 2;
  local_e78._M_elems[3] = 0xb;
  local_e10 = &local_e78;
  local_e08 = 3;
  local_e00 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_df8;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_e79);
  __l_12._M_len = local_e08;
  __l_12._M_array = local_e10;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_df8,
             __l_12,&local_e79);
  local_e00 = &local_de0;
  local_de0.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  local_de0.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  local_de0.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector(local_e00);
  local_ea8 = 0x300000000;
  uStack_ea0 = 0x7ffffffff;
  local_eb8 = 0x10000000a;
  uStack_eb0 = 0x600000002;
  local_ed8._M_elems[4] = 1;
  local_ed8._M_elems[5] = 8;
  local_ed8._M_elems[6] = 1;
  local_ed8._M_elems[7] = 4;
  local_ed8._M_elems[0] = 10;
  local_ed8._M_elems[1] = 1;
  local_ed8._M_elems[2] = 1;
  local_ed8._M_elems[3] = 0xb;
  local_e90 = &local_ed8;
  local_e88 = 2;
  local_e00 = &local_dc8;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_ed9);
  __l_11._M_len = local_e88;
  __l_11._M_array = local_e90;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_dc8,__l_11,&local_ed9);
  local_f08 = 0x300000000;
  uStack_f00 = 0x8ffffffff;
  local_f18 = 0x10000000a;
  uStack_f10 = 0x600000002;
  local_f38._M_elems[4] = 1;
  local_f38._M_elems[5] = 8;
  local_f38._M_elems[6] = 1;
  local_f38._M_elems[7] = 5;
  local_f38._M_elems[0] = 10;
  local_f38._M_elems[1] = 1;
  local_f38._M_elems[2] = 1;
  local_f38._M_elems[3] = 0xb;
  local_ef0 = &local_f38;
  local_ee8 = 2;
  local_e00 = &local_db0;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_f39);
  __l_10._M_len = local_ee8;
  __l_10._M_array = local_ef0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_db0,__l_10,&local_f39);
  local_f68 = 0xa00000000;
  uStack_f60 = 0x800000001;
  local_f78 = 0xffffffff00000003;
  uStack_f70 = 0x600000001;
  local_f88 = 0xa00000000;
  uStack_f80 = 0x700000001;
  local_f98 = 0xffffffff00000003;
  uStack_f90 = 0x600000001;
  local_fb8._M_elems[4] = 1;
  local_fb8._M_elems[5] = 8;
  local_fb8._M_elems[6] = 1;
  local_fb8._M_elems[7] = 6;
  local_fb8._M_elems[0] = 3;
  local_fb8._M_elems[1] = -1;
  local_fb8._M_elems[2] = 2;
  local_fb8._M_elems[3] = 0xb;
  local_f50 = &local_fb8;
  local_f48 = 3;
  paVar3 = (allocator<std::array<int,_8UL>_> *)
           ((long)&adjacency_list_05_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_e00 = &local_d98;
  std::allocator<std::array<int,_8UL>_>::allocator(paVar3);
  __l_09._M_len = local_f48;
  __l_09._M_array = local_f50;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_d98,__l_09,paVar3);
  adjacency_list_05_ground_truth.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_d80._0_8_ = local_df8;
  local_d80._8_8_ = (pointer)0x5;
  paVar4 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *)
           ((long)&adjacency_list_05_ground_truth.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  allocator(paVar4);
  __l_13._M_len = local_d80._8_8_;
  __l_13._M_array = (iterator)local_d80._0_8_;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)(local_d80 + 0x10),__l_13,paVar4);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
              *)((long)&adjacency_list_05_ground_truth.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_1770 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_d80;
  do {
    local_1770 = local_1770 + -1;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(local_1770);
  } while (local_1770 !=
           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_df8);
  std::allocator<std::array<int,_8UL>_>::~allocator
            ((allocator<std::array<int,_8UL>_> *)
             ((long)&adjacency_list_05_ground_truth.
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_f39);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_ed9);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_e79);
  adjacency_info_05_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 1;
  local_1080[0] = 2;
  local_1080[1] = 3;
  local_1078 = local_1080;
  local_1070 = 2;
  local_1068 = &local_1060;
  std::allocator<int>::allocator(&local_1081);
  __l_07._M_len = local_1070;
  __l_07._M_array = local_1078;
  std::vector<int,_std::allocator<int>_>::vector(&local_1060,__l_07,&local_1081);
  local_1068 = &local_1048;
  local_1048.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_1048.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_1048.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(local_1068);
  local_10a0[0] = 4;
  local_10a0[1] = 0;
  local_1098 = local_10a0;
  local_1090 = 2;
  local_1068 = &local_1030;
  std::allocator<int>::allocator(&local_10a1);
  __l_06._M_len = local_1090;
  __l_06._M_array = local_1098;
  std::vector<int,_std::allocator<int>_>::vector(&local_1030,__l_06,&local_10a1);
  local_10c0[0] = 4;
  local_10c0[1] = 0;
  local_10b8 = local_10c0;
  local_10b0 = 2;
  local_1068 = &local_1018;
  std::allocator<int>::allocator(&local_10c1);
  __l_05._M_len = local_10b0;
  __l_05._M_array = local_10b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_1018,__l_05,&local_10c1);
  local_10e0[0] = 2;
  local_10e0[1] = 3;
  local_10d8 = local_10e0;
  local_10d0 = 2;
  paVar1 = (allocator<int> *)
           ((long)&adjacency_info_05_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 7);
  local_1068 = &local_1000;
  std::allocator<int>::allocator(paVar1);
  __l_04._M_len = local_10d0;
  __l_04._M_array = local_10d8;
  std::vector<int,_std::allocator<int>_>::vector(&local_1000,__l_04,paVar1);
  adjacency_info_05_ground_truth.
  super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._6_1_ = 0;
  local_fe8._0_8_ = &local_1060;
  local_fe8._8_8_ = (pointer)0x5;
  paVar2 = (allocator<std::vector<int,_std::allocator<int>_>_> *)
           ((long)&adjacency_info_05_ground_truth.
                   super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage + 5);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator(paVar2);
  __l_08._M_len = local_fe8._8_8_;
  __l_08._M_array = (iterator)local_fe8._0_8_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
            *)(local_fe8 + 0x10),__l_08,paVar2);
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)
             ((long)&adjacency_info_05_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 5));
  local_17d0 = (vector<int,_std::allocator<int>_> *)local_fe8;
  do {
    local_17d0 = local_17d0 + -1;
    std::vector<int,_std::allocator<int>_>::~vector(local_17d0);
  } while (local_17d0 != &local_1060);
  std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&adjacency_info_05_ground_truth.
                     super__Vector_base<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::allocator<int>::~allocator(&local_10c1);
  std::allocator<int>::~allocator(&local_10a1);
  std::allocator<int>::~allocator(&local_1081);
  gtest_ar.message_.ptr_._6_1_ = 1;
  local_11b8 = 0xd00000000;
  uStack_11b0 = 0xa00000001;
  local_11c8 = 0x10000000c;
  uStack_11c0 = 0x600000002;
  local_11e8._M_elems[4] = 0;
  local_11e8._M_elems[5] = 0xd;
  local_11e8._M_elems[6] = 1;
  local_11e8._M_elems[7] = 9;
  local_11e8._M_elems[0] = 0xc;
  local_11e8._M_elems[1] = 1;
  local_11e8._M_elems[2] = 2;
  local_11e8._M_elems[3] = 6;
  local_11a0 = &local_11e8;
  local_1198 = 2;
  local_1190 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_1188;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_11e9);
  __l_02._M_len = local_1198;
  __l_02._M_array = local_11a0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_1188,
             __l_02,&local_11e9);
  local_1190 = &local_1170;
  local_1170.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1170.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1170.super__Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector(local_1190);
  local_1218 = 0xc00000000;
  uStack_1210 = 0x900000001;
  local_1228 = 0x10000000d;
  uStack_1220 = 0x600000001;
  local_1248._M_elems[4] = 1;
  local_1248._M_elems[5] = 3;
  local_1248._M_elems[6] = -2;
  local_1248._M_elems[7] = 7;
  local_1248._M_elems[0] = 0xd;
  local_1248._M_elems[1] = 1;
  local_1248._M_elems[2] = 2;
  local_1248._M_elems[3] = 0xb;
  local_1200 = &local_1248;
  local_11f8 = 2;
  local_1190 = &local_1158;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_1249);
  __l_01._M_len = local_11f8;
  __l_01._M_array = local_1200;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_1158,__l_01,&local_1249);
  local_1278 = 0xc00000000;
  uStack_1270 = 0xa00000001;
  local_1288 = 0x10000000d;
  uStack_1280 = 0x600000001;
  local_12a8._M_elems[4] = 1;
  local_12a8._M_elems[5] = 3;
  local_12a8._M_elems[6] = -2;
  local_12a8._M_elems[7] = 8;
  local_12a8._M_elems[0] = 0xd;
  local_12a8._M_elems[1] = 1;
  local_12a8._M_elems[2] = 2;
  local_12a8._M_elems[3] = 0xb;
  local_1260 = &local_12a8;
  local_1258 = 2;
  local_1190 = &local_1140;
  std::allocator<std::array<int,_8UL>_>::allocator(&local_12a9);
  __l_00._M_len = local_1258;
  __l_00._M_array = local_1260;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_1140,__l_00,&local_12a9);
  local_12d8 = 0xd00000001;
  uStack_12d0 = 0x800000001;
  local_12e8 = 0xfffffffe00000003;
  uStack_12e0 = 0xb00000001;
  local_1308._M_elems[4] = 1;
  local_1308._M_elems[5] = 0xd;
  local_1308._M_elems[6] = 1;
  local_1308._M_elems[7] = 7;
  local_1308._M_elems[0] = 3;
  local_1308._M_elems[1] = -2;
  local_1308._M_elems[2] = 1;
  local_1308._M_elems[3] = 0xb;
  local_12c0 = &local_1308;
  local_12b8 = 2;
  paVar3 = (allocator<std::array<int,_8UL>_> *)((long)&gtest_ar.message_.ptr_ + 7);
  local_1190 = &local_1128;
  std::allocator<std::array<int,_8UL>_>::allocator(paVar3);
  __l._M_len = local_12b8;
  __l._M_array = local_12c0;
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::vector
            (&local_1128,__l,paVar3);
  gtest_ar.message_.ptr_._6_1_ = 0;
  local_1110._0_8_ = local_1188;
  local_1110._8_8_ = (pointer)0x5;
  paVar4 = (allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_> *)
           ((long)&gtest_ar.message_.ptr_ + 5);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  allocator(paVar4);
  __l_03._M_len = local_1110._8_8_;
  __l_03._M_array = (iterator)local_1110._0_8_;
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
            *)(local_1110 + 0x10),__l_03,paVar4);
  std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>::
  ~allocator((allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>
              *)((long)&gtest_ar.message_.ptr_ + 5));
  local_1830 = (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_1110;
  do {
    local_1830 = local_1830 + -1;
    std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector(local_1830);
  } while (local_1830 !=
           (vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)local_1188);
  std::allocator<std::array<int,_8UL>_>::~allocator
            ((allocator<std::array<int,_8UL>_> *)((long)&gtest_ar.message_.ptr_ + 7));
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_12a9);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_1249);
  std::allocator<std::array<int,_8UL>_>::~allocator(&local_11e9);
  pvVar6 = std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
           ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                         *)&adjacency_list_01_ground_truth.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
  testing::internal::EqHelper<false>::
  Compare<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
            ((EqHelper<false> *)local_1320,"adjacency_lists[0].adjacencyList",
             "adjacency_list_01_ground_truth",&pvVar6->adjacencyList,
             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              *)(local_408 + 0x10));
  bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1320);
  if (!bVar5) {
    testing::Message::Message(&local_1328);
    pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1320);
    testing::internal::AssertHelper::AssertHelper
              (&local_1330,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
               ,0x6d,pcVar7);
    testing::internal::AssertHelper::operator=(&local_1330,&local_1328);
    testing::internal::AssertHelper::~AssertHelper(&local_1330);
    testing::Message::~Message(&local_1328);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1320);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    pvVar6 = std::
             vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
             operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                         *)&adjacency_list_01_ground_truth.
                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    testing::internal::EqHelper<false>::
    Compare<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
              ((EqHelper<false> *)local_1348,"adjacency_lists[0].adjacencyEdgeInfo",
               "adjacency_info_01_ground_truth",&pvVar6->adjacencyEdgeInfo,
               (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                *)(local_4c8 + 0x10));
    bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1348);
    if (!bVar5) {
      testing::Message::Message(&local_1350);
      pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1348);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                 ,0x6e,pcVar7);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_1350);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_1350);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1348);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      pvVar6 = std::
               vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::
               operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                           *)&adjacency_list_01_ground_truth.
                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
      testing::internal::EqHelper<false>::
      Compare<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                ((EqHelper<false> *)local_1368,"adjacency_lists[1].adjacencyList",
                 "adjacency_list_02_ground_truth",&pvVar6->adjacencyList,
                 (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                  *)(local_5d8 + 0x10));
      bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1368);
      if (!bVar5) {
        testing::Message::Message(&local_1370);
        pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1368);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                   ,0x6f,pcVar7);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_1370)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_1370);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        pvVar6 = std::
                 vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                 ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                               *)&adjacency_list_01_ground_truth.
                                  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
        testing::internal::EqHelper<false>::
        Compare<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                  ((EqHelper<false> *)local_1388,"adjacency_lists[1].adjacencyEdgeInfo",
                   "adjacency_info_02_ground_truth",&pvVar6->adjacencyEdgeInfo,
                   (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                    *)(local_6d0 + 0x10));
        bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1388);
        if (!bVar5) {
          testing::Message::Message(&local_1390);
          pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1388);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_4.message_,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                     ,0x70,pcVar7);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_4.message_,&local_1390);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
          testing::Message::~Message(&local_1390);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_1388);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          pvVar6 = std::
                   vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                   ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                 *)&adjacency_list_01_ground_truth.
                                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
          testing::internal::EqHelper<false>::
          Compare<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                    ((EqHelper<false> *)local_13a8,"adjacency_lists[2].adjacencyList",
                     "adjacency_list_03_ground_truth",&pvVar6->adjacencyList,
                     (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      *)(local_898 + 0x10));
          bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13a8);
          if (!bVar5) {
            testing::Message::Message(&local_13b0);
            pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_13a8);
            testing::internal::AssertHelper::AssertHelper
                      ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                       ,0x71,pcVar7);
            testing::internal::AssertHelper::operator=
                      ((AssertHelper *)&gtest_ar_5.message_,&local_13b0);
            testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
            testing::Message::~Message(&local_13b0);
          }
          gtest_ar_1.message_.ptr_._5_3_ = 0;
          gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_13a8);
          if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
            pvVar6 = std::
                     vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                     ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                   *)&adjacency_list_01_ground_truth.
                                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage,2);
            testing::internal::EqHelper<false>::
            Compare<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                      ((EqHelper<false> *)local_13c8,"adjacency_lists[2].adjacencyEdgeInfo",
                       "adjacency_info_03_ground_truth",&pvVar6->adjacencyEdgeInfo,
                       (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                        *)(local_9d8 + 0x10));
            bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13c8);
            if (!bVar5) {
              testing::Message::Message(&local_13d0);
              pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_13c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                         ,0x72,pcVar7);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar_6.message_,&local_13d0);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
              testing::Message::~Message(&local_13d0);
            }
            gtest_ar_1.message_.ptr_._5_3_ = 0;
            gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_13c8);
            if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
              pvVar6 = std::
                       vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                       ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                     *)&adjacency_list_01_ground_truth.
                                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
              testing::internal::EqHelper<false>::
              Compare<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                        ((EqHelper<false> *)local_13e8,"adjacency_lists[3].adjacencyList",
                         "adjacency_list_04_ground_truth",&pvVar6->adjacencyList,
                         (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          *)(local_c58 + 0x10));
              bVar5 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_13e8)
              ;
              if (!bVar5) {
                testing::Message::Message(&local_13f0);
                pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_13e8);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&gtest_ar_7.message_,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                           ,0x73,pcVar7);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&gtest_ar_7.message_,&local_13f0);
                testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_)
                ;
                testing::Message::~Message(&local_13f0);
              }
              gtest_ar_1.message_.ptr_._5_3_ = 0;
              gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_13e8);
              if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                pvVar6 = std::
                         vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                         ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                       *)&adjacency_list_01_ground_truth.
                                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage,3);
                testing::internal::EqHelper<false>::
                Compare<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                          ((EqHelper<false> *)local_1408,"adjacency_lists[3].adjacencyEdgeInfo",
                           "adjacency_info_04_ground_truth",&pvVar6->adjacencyEdgeInfo,
                           (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                            *)(local_d80 + 0x10));
                bVar5 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_1408);
                if (!bVar5) {
                  testing::Message::Message(&local_1410);
                  pcVar7 = testing::AssertionResult::failure_message((AssertionResult *)local_1408);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                             ,0x74,pcVar7);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_8.message_,&local_1410);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_8.message_);
                  testing::Message::~Message(&local_1410);
                }
                gtest_ar_1.message_.ptr_._5_3_ = 0;
                gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_1408);
                if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                  pvVar6 = std::
                           vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                           ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                         *)&adjacency_list_01_ground_truth.
                                            super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage,4);
                  testing::internal::EqHelper<false>::
                  Compare<std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>,std::vector<std::vector<int,std::allocator<int>>,std::allocator<std::vector<int,std::allocator<int>>>>>
                            ((EqHelper<false> *)local_1428,"adjacency_lists[4].adjacencyList",
                             "adjacency_list_05_ground_truth",&pvVar6->adjacencyList,
                             (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                              *)(local_fe8 + 0x10));
                  bVar5 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_1428);
                  if (!bVar5) {
                    testing::Message::Message(&local_1430);
                    pcVar7 = testing::AssertionResult::failure_message
                                       ((AssertionResult *)local_1428);
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                               ,0x75,pcVar7);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar_9.message_,&local_1430);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar_9.message_);
                    testing::Message::~Message(&local_1430);
                  }
                  gtest_ar_1.message_.ptr_._5_3_ = 0;
                  gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1428);
                  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                    pvVar6 = std::
                             vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                             ::operator[]((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
                                           *)&adjacency_list_01_ground_truth.
                                              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage,4);
                    testing::internal::EqHelper<false>::
                    Compare<std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>,std::vector<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>,std::allocator<std::vector<std::array<int,8ul>,std::allocator<std::array<int,8ul>>>>>>
                              ((EqHelper<false> *)local_1448,"adjacency_lists[4].adjacencyEdgeInfo",
                               "adjacency_info_05_ground_truth",&pvVar6->adjacencyEdgeInfo,
                               (vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
                                *)(local_1110 + 0x10));
                    bVar5 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1448);
                    if (!bVar5) {
                      testing::Message::Message(&local_1450);
                      pcVar7 = testing::AssertionResult::failure_message
                                         ((AssertionResult *)local_1448);
                      testing::internal::AssertHelper::AssertHelper
                                (&local_1458,kFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/karelvaculik[P]dgrminer/test/unit/test_partial_union.cpp"
                                 ,0x76,pcVar7);
                      testing::internal::AssertHelper::operator=(&local_1458,&local_1450);
                      testing::internal::AssertHelper::~AssertHelper(&local_1458);
                      testing::Message::~Message(&local_1450);
                    }
                    gtest_ar_1.message_.ptr_._5_3_ = 0;
                    gtest_ar_1.message_.ptr_._4_1_ = !bVar5;
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1448);
                    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
                      gtest_ar_1.message_.ptr_._4_4_ = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             *)(local_1110 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_fe8 + 0x10));
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             *)(local_d80 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_c58 + 0x10));
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             *)(local_9d8 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_898 + 0x10));
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             *)(local_6d0 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_5d8 + 0x10));
  std::
  vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
  ::~vector((vector<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>,_std::allocator<std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>_>_>
             *)(local_4c8 + 0x10));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
             *)(local_408 + 0x10));
  std::vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>::~vector
            ((vector<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_> *)
             &adjacency_list_01_ground_truth.
              super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
  ::~set((set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
          *)&adjacency_lists.
             super__Vector_base<dgrminer::AdjacencyListCrate,_std::allocator<dgrminer::AdjacencyListCrate>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::~vector
            ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
             &edges_set._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
  ::~set((set<dgrminer::labeled_node_time,_std::less<dgrminer::labeled_node_time>,_std::allocator<dgrminer::labeled_node_time>_>
          *)local_378);
  std::__cxx11::string::~string(local_1a8);
  dgrminer::PartialUnion::~PartialUnion((PartialUnion *)&window_size);
  return;
}

Assistant:

TEST(PartialUnion, create_adjacency_lists) {
    // assumes working file reader

    FileReader fr;
    PartialUnion pu;
    bool search_for_anomalies = false;
    int window_size = 10;
    std::string input_file = "data/intro_example";

    pu = fr.read_dynamic_graph_from_file(input_file, window_size, search_for_anomalies);

    std::set<labeled_node_time> labeled_nodes = pu.compute_labeled_nodes();
    int snapshots = pu.getNumberOfSnapshots();
    std::vector<std::array<int, 8>> newedges;
    std::set<labeled_edge_with_occurrences> edges_set;
    pu.compute_labeled_edges(newedges, edges_set, labeled_nodes, false);
    std::vector<AdjacencyListCrate> adjacency_lists = pu.createAdjacencyLists(newedges, snapshots);

//    for (int i = 0; i < adjacency_lists.size(); ++i) {
//        println("LIST: ");
//        println(adjacency_lists[i].adjacencyList);
//        println(adjacency_lists[i].adjacencyEdgeInfo);
//    }
//
//    for (int j = 0; j < 14; ++j) {
//        println("LABEL: ", j, " ", pu.getEncodingLabel(j));
//    }

    std::vector<std::vector<int>> adjacency_list_01_ground_truth = {{1},
                                                                    {0},
                                                                    {},
                                                                    {}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_01_ground_truth = {
            {{2, 0, 1, 6, 0, 4, 0, 1}}, // added nodes with edges (all changetimes = 0)
            {{4, 0, 2, 6, 0, 2, 0, 1}},
            {},
            {}
    };
    std::vector<std::vector<int>> adjacency_list_02_ground_truth = {{1},
                                                                    {0, 2, 3},
                                                                    {1},
                                                                    {1}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_02_ground_truth = {
            {{8,  1,  1, 11, 1, 3, -1, 1}}, // label change of node with 0 (label 2->8, i.e. +C -> C=>D, changetime 1), label of 1 stays (4 -> 3, i.e. +A -> A, changetime - 1)
            {{3,  -1, 2, 11, 1, 8, 1,  1}, {3, -1, 1, 6, 0, 10, 1, 2}, {3, -1, 1, 6, 0, 10, 1, 3}},
            {{10, 1,  2, 6,  0, 3, -1, 2}},
            {{10, 1,  2, 6,  0, 3, -1, 3}}
    };
    std::vector<std::vector<int>> adjacency_list_03_ground_truth = {{2, 3, 4},
                                                                    {2, 3},
                                                                    {1, 0},
                                                                    {1, 0},
                                                                    {0}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_03_ground_truth = {
            {{12, 1,  2, 6,  0, 13, 1,  4}, {12, 1,  2, 6,  0, 13, 1, 5}, {12, 1, 1, 6, 0, 4, 0, 6}},
            {{3,  -2, 1, 11, 1, 13, 1,  2}, {3,  -2, 1, 11, 1, 13, 1, 3}},
            {{13, 1,  2, 11, 1, 3,  -2, 2}, {13, 1,  1, 6,  0, 12, 1, 4}},
            {{13, 1,  2, 11, 1, 3,  -2, 3}, {13, 1,  1, 6,  0, 12, 1, 5}},
            {{4,  0,  2, 6,  0, 12, 1,  6}}

    };
    std::vector<std::vector<int>> adjacency_list_04_ground_truth = {{2, 3, 4},
                                                                    {},
                                                                    {0, 4},
                                                                    {0, 4},
                                                                    {0, 2, 3}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_04_ground_truth = {
            {{8,  1,  2, 11, 1, 10, 1, 4}, {8,  1,  2, 11, 1, 10, 1,  5}, {8, 1,  1, 11, 1, 3,  -1, 6}},
            {},
            {{10, 1,  1, 11, 1, 8,  1, 4}, {10, 1,  2, 6,  0, 3,  -1, 7}},
            {{10, 1,  1, 11, 1, 8,  1, 5}, {10, 1,  2, 6,  0, 3,  -1, 8}},
            {{3,  -1, 2, 11, 1, 8,  1, 6}, {3,  -1, 1, 6,  0, 10, 1,  7}, {3, -1, 1, 6,  0, 10, 1,  8}}

    };
    std::vector<std::vector<int>> adjacency_list_05_ground_truth = {{2, 3},
                                                                    {},
                                                                    {4, 0},
                                                                    {4, 0},
                                                                    {2, 3}};
    std::vector<std::vector<std::array<int, ADJ_INFO___SIZE>>> adjacency_info_05_ground_truth = {
            {{12, 1,  2, 6,  0, 13, 1,  9}, {12, 1,  2, 6,  0, 13, 1, 10}},
            {},
            {{13, 1,  2, 11, 1, 3,  -2, 7}, {13, 1,  1, 6,  0, 12, 1, 9}},
            {{13, 1,  2, 11, 1, 3,  -2, 8}, {13, 1,  1, 6,  0, 12, 1, 10}},
            {{3,  -2, 1, 11, 1, 13, 1,  7}, {3,  -2, 1, 11, 1, 13, 1, 8}}
    };

    ASSERT_EQ(adjacency_lists[0].adjacencyList, adjacency_list_01_ground_truth);
    ASSERT_EQ(adjacency_lists[0].adjacencyEdgeInfo, adjacency_info_01_ground_truth);
    ASSERT_EQ(adjacency_lists[1].adjacencyList, adjacency_list_02_ground_truth);
    ASSERT_EQ(adjacency_lists[1].adjacencyEdgeInfo, adjacency_info_02_ground_truth);
    ASSERT_EQ(adjacency_lists[2].adjacencyList, adjacency_list_03_ground_truth);
    ASSERT_EQ(adjacency_lists[2].adjacencyEdgeInfo, adjacency_info_03_ground_truth);
    ASSERT_EQ(adjacency_lists[3].adjacencyList, adjacency_list_04_ground_truth);
    ASSERT_EQ(adjacency_lists[3].adjacencyEdgeInfo, adjacency_info_04_ground_truth);
    ASSERT_EQ(adjacency_lists[4].adjacencyList, adjacency_list_05_ground_truth);
    ASSERT_EQ(adjacency_lists[4].adjacencyEdgeInfo, adjacency_info_05_ground_truth);

}